

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstarplanner.cpp
# Opt level: O2

void __thiscall RSTARPlanner::PrintSearchPath(RSTARPlanner *this,FILE *fOut)

{
  DiscreteSpaceInformation *pDVar1;
  uint *puVar2;
  int sind;
  size_type __n;
  vector<int,_std::allocator<int>_> pathIds;
  int solcost;
  _Vector_base<int,_std::allocator<int>_> local_68;
  int local_44;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetSearchPath((vector<int,_std::allocator<int>_> *)&local_40,this,&local_44);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            ((vector<int,_std::allocator<int>_> *)&local_68,&local_40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  for (__n = 0; (long)__n <
                (long)(int)((ulong)((long)local_68._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_68._M_impl.super__Vector_impl_data._M_start) >> 2);
      __n = __n + 1) {
    pDVar1 = (this->super_SBPLPlanner).environment_;
    puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)&local_68,__n);
    (*pDVar1->_vptr_DiscreteSpaceInformation[0x12])(pDVar1,(ulong)*puVar2,0,fOut);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void RSTARPlanner::PrintSearchPath(FILE* fOut)
{
    vector<int> pathIds;
    int solcost;

    pathIds = GetSearchPath(solcost);

    SBPL_FPRINTF(fOut, "high-level solution cost = %d, solution length=%d\n", solcost, (unsigned int)pathIds.size());
    for (int sind = 0; sind < (int)pathIds.size(); sind++) {
        environment_->PrintState(pathIds.at(sind), false, fOut);
    }
}